

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall choc::value::Type::Object::Object(Object *this,Allocator *a,Object *other)

{
  char *in_RCX;
  string_view sVar1;
  string_view s;
  MemberNameAndType local_98;
  MemberNameAndType *local_68;
  MemberNameAndType *m;
  MemberNameAndType *__end2;
  MemberNameAndType *__begin2;
  AllocatedVector<choc::value::MemberNameAndType> *__range2;
  Allocator *local_38;
  char *pcStack_30;
  Object *local_20;
  Object *other_local;
  Allocator *a_local;
  Object *this_local;
  
  local_38 = (Allocator *)(other->className)._M_len;
  pcStack_30 = (other->className)._M_str;
  sVar1._M_str = in_RCX;
  sVar1._M_len = (size_t)pcStack_30;
  local_20 = other;
  other_local = (Object *)a;
  a_local = (Allocator *)this;
  sVar1 = anon_unknown_15::allocateString((anon_unknown_15 *)a,local_38,sVar1);
  this->className = sVar1;
  AllocatedVector<choc::value::MemberNameAndType>::AllocatedVector
            (&this->members,(Allocator *)other_local);
  AllocatedVector<choc::value::MemberNameAndType>::reserve(&this->members,(local_20->members).size);
  __begin2 = (MemberNameAndType *)&local_20->members;
  __end2 = AllocatedVector<choc::value::MemberNameAndType>::begin
                     ((AllocatedVector<choc::value::MemberNameAndType> *)__begin2);
  m = AllocatedVector<choc::value::MemberNameAndType>::end
                ((AllocatedVector<choc::value::MemberNameAndType> *)__begin2);
  for (; __end2 != m; __end2 = __end2 + 1) {
    local_68 = __end2;
    s._M_str = (char *)__end2;
    s._M_len = (size_t)(__end2->name)._M_str;
    local_98.name =
         anon_unknown_15::allocateString
                   ((anon_unknown_15 *)other_local,(Allocator *)(__end2->name)._M_len,s);
    Type(&local_98.type,(Allocator *)other_local,&local_68->type);
    AllocatedVector<choc::value::MemberNameAndType>::push_back(&this->members,&local_98);
    MemberNameAndType::~MemberNameAndType(&local_98);
  }
  return;
}

Assistant:

Object (Allocator* a, const Object& other) : className (allocateString (a, other.className)), members (a)
    {
        members.reserve (other.members.size);

        for (auto& m : other.members)
            members.push_back ({ allocateString (a, m.name), Type (a, m.type) });
    }